

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_to_n32_unsafe.cc
# Opt level: O3

bool s_to_u32_unsafe(char *s,char *s_end,uint32_t *number)

{
  ulong uVar1;
  
  uVar1 = 0;
  if (s != s_end) {
    do {
      uVar1 = (ulong)((int)*s - 0x30) + uVar1 * 10;
      if (0xfffffffe < uVar1) {
        return false;
      }
      s = s + 1;
    } while (s != s_end);
  }
  *number = (uint32_t)uVar1;
  return true;
}

Assistant:

bool s_to_u32_unsafe (const char * s, const char * s_end, uint32_t & number)
{
	uint64_t u = 0;
	for (; s != s_end; ++s)
	{
		u *= 10;
		u += static_cast<uint32_t> (*s) - 0x30;
		if (u >= std::numeric_limits<uint32_t>::max())
		{
			return false;
		}
	}
	number = static_cast<uint32_t> (u);
	return true;
}